

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClassDefinition
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  mapped_type *pmVar5;
  ulong uVar6;
  FileDescriptor *pFVar7;
  MessageOptions *this_02;
  string *psVar8;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_03;
  EnumGenerator *this_04;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_05;
  ExtensionGenerator *this_06;
  FieldDescriptor *pFVar9;
  size_type sVar10;
  reference ppFVar11;
  FieldGenerator *pFVar12;
  FileDescriptor *this_07;
  undefined1 qualified;
  int i_00;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  string local_290;
  string local_270;
  string local_250;
  int local_22c;
  FieldDescriptor *pFStack_228;
  int i_6;
  int local_21c;
  undefined1 local_218 [4];
  int i_5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string local_1e0;
  int local_1bc;
  int local_1b8;
  int i_4;
  int i_3;
  int i_2;
  cxx *local_190;
  Descriptor *nested_type;
  int i_1;
  string local_160;
  allocator<char> local_139;
  key_type local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  string local_a8;
  allocator<char> local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  for (vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      iVar4 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
      iVar2 = Descriptor::nested_type_count(this->descriptor_), iVar4 < iVar2;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,
                           (long)vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateClassDefinition(this_01,printer);
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// -------------------------------------------------------------------\n");
    io::Printer::Print(printer,"\n");
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"classname",&local_71);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&this->classname_);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  uVar3 = Descriptor::field_count(this->descriptor_);
  SimpleItoa_abi_cxx11_(&local_a8,(protobuf *)(ulong)uVar3,i_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"field_count",&local_c9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::operator+(&local_118,&(this->options_).dllexport_decl," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"dllexport",&local_139);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_118);
    descriptor = extraout_RDX_00;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"dllexport",&local_f1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    descriptor = extraout_RDX;
  }
  SuperClassName_abi_cxx11_(&local_160,(cxx *)this->descriptor_,descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_1,"superclass",(allocator<char> *)((long)&nested_type + 7));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,(key_type *)&i_1);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_160);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&nested_type + 7));
  std::__cxx11::string::~string((string *)&local_160);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,
                     "class $dllexport$$classname$ : public $superclass$ {\n public:\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,
                     "$classname$();\nvirtual ~$classname$();\n\n$classname$(const $classname$& from);\n\ninline $classname$& operator=(const $classname$& from) {\n  CopyFrom(from);\n  return *this;\n}\n\n"
                    );
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar1 = HasUnknownFields(pFVar7);
  if (bVar1) {
    io::Printer::Print(printer,
                       "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n  return _unknown_fields_;\n}\n\ninline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n  return &_unknown_fields_;\n}\n\n"
                      );
  }
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(pFVar7);
  if (bVar1) {
    this_02 = Descriptor::options(this->descriptor_);
    bVar1 = MessageOptions::no_standard_descriptor_accessor(this_02);
    if (!bVar1) {
      io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_50,
                         "static const ::google::protobuf::Descriptor* descriptor();\n");
    }
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,"static const $classname$& default_instance();\n\n");
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar1 = StaticInitializersForced(pFVar7);
  if (!bVar1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n// Returns the internal default instance pointer. This function can\n// return NULL thus should not be used by the user. This is intended\n// for Protobuf internal code. Please use default_instance() declared\n// above instead.\nstatic inline const $classname$* internal_default_instance() {\n  return default_instance_;\n}\n#endif\n\n"
                      );
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,
                     "void Swap($classname$* other);\n\n// implements Message ----------------------------------------------\n\n$classname$* New() const;\n"
                    );
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar1 = HasGeneratedMethods(pFVar7);
  if (bVar1) {
    pFVar7 = Descriptor::file(this->descriptor_);
    bVar1 = HasDescriptorMethods(pFVar7);
    if (bVar1) {
      io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_50,
                         "void CopyFrom(const ::google::protobuf::Message& from);\nvoid MergeFrom(const ::google::protobuf::Message& from);\n"
                        );
    }
    else {
      io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_50,
                         "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n"
                        );
    }
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "void CopyFrom(const $classname$& from);\nvoid MergeFrom(const $classname$& from);\nvoid Clear();\nbool IsInitialized() const;\n\nint ByteSize() const;\nbool MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input);\nvoid SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const;\n"
                      );
    pFVar7 = Descriptor::file(this->descriptor_);
    bVar1 = HasFastArraySerialization(pFVar7);
    if (bVar1) {
      io::Printer::Print(printer,
                         "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n"
                        );
    }
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,
                     "int GetCachedSize() const { return _cached_size_; }\nprivate:\nvoid SharedCtor();\nvoid SharedDtor();\nvoid SetCachedSize(int size) const;\npublic:\n\n"
                    );
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(pFVar7);
  if (bVar1) {
    io::Printer::Print(printer,"::google::protobuf::Metadata GetMetadata() const;\n\n");
  }
  else {
    io::Printer::Print(printer,"::std::string GetTypeName() const;\n\n");
  }
  io::Printer::Print(printer,
                     "// xml support -----------------------------------------------------\n\n");
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,
                     "// Parse a protocol buffer contained in a string.\nbool ParseFromXmlString(const std::string& data);\n// Like ParseFromXmlString(), but accepts messages that are missing\n// required fields.\nbool ParsePartialFromXmlString(const std::string& data);\n\n// Serialize the message and store it in the given string.  All required\n// fields must be set.\nbool SerializeToXmlString(std::string* output) const;\n// Like SerializeToXmlString(), but allows missing required fields.\nbool SerializePartialToXmlString(std::string* output) const;\n\n"
                    );
  io::Printer::Print(printer,
                     "// nested types ----------------------------------------------------\n\n");
  nested_type._0_4_ = 0;
  while( true ) {
    iVar4 = (int)nested_type;
    iVar2 = Descriptor::nested_type_count(this->descriptor_);
    qualified = (undefined1)iVar2;
    if (iVar2 <= iVar4) break;
    local_190 = (cxx *)Descriptor::nested_type(this->descriptor_,(int)nested_type);
    psVar8 = Descriptor::name_abi_cxx11_((Descriptor *)local_190);
    ClassName_abi_cxx11_((string *)&i_3,local_190,(Descriptor *)0x0,(bool)qualified);
    io::Printer::Print(printer,"typedef $nested_full_name$ $nested_name$;\n","nested_name",psVar8,
                       "nested_full_name",(string *)&i_3);
    std::__cxx11::string::~string((string *)&i_3);
    nested_type._0_4_ = (int)nested_type + 1;
  }
  iVar4 = Descriptor::nested_type_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print(printer,"\n");
  }
  for (i_4 = 0; iVar4 = i_4, iVar2 = Descriptor::enum_type_count(this->descriptor_), iVar4 < iVar2;
      i_4 = i_4 + 1) {
    this_03 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,(long)i_4);
    this_04 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_03);
    EnumGenerator::GenerateSymbolImports(this_04,printer);
    io::Printer::Print(printer,"\n");
  }
  io::Printer::Print(printer,
                     "// accessors -------------------------------------------------------\n\n");
  GenerateFieldAccessorDeclarations(this,printer);
  for (local_1b8 = 0; iVar4 = local_1b8, iVar2 = Descriptor::extension_count(this->descriptor_),
      iVar4 < iVar2; local_1b8 = local_1b8 + 1) {
    this_05 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_1b8);
    this_06 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_05);
    ExtensionGenerator::GenerateDeclaration(this_06,printer);
  }
  psVar8 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(printer,"// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     psVar8);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," private:\n");
  io::Printer::Indent(printer);
  for (local_1bc = 0; iVar4 = local_1bc, iVar2 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar2; local_1bc = local_1bc + 1) {
    pFVar9 = Descriptor::field(this->descriptor_,local_1bc);
    bVar1 = FieldDescriptor::is_repeated(pFVar9);
    if (!bVar1) {
      pFVar9 = Descriptor::field(this->descriptor_,local_1bc);
      FieldName_abi_cxx11_(&local_1e0,(cxx *)pFVar9,field);
      io::Printer::Print(printer,"inline void set_has_$name$();\n","name",&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      pFVar9 = Descriptor::field(this->descriptor_,local_1bc);
      FieldName_abi_cxx11_
                ((string *)
                 &fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(cxx *)pFVar9,field_00);
      io::Printer::Print(printer,"inline void clear_has_$name$();\n","name",
                         (string *)
                         &fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  io::Printer::Print(printer,"\n");
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print(printer,"::google::protobuf::internal::ExtensionSet _extensions_;\n\n");
  }
  pFVar7 = Descriptor::file(this->descriptor_);
  bVar1 = HasUnknownFields(pFVar7);
  if (bVar1) {
    io::Printer::Print(printer,"::google::protobuf::UnknownFieldSet _unknown_fields_;\n\n");
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_218);
  for (local_21c = 0; iVar4 = local_21c, iVar2 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar2; local_21c = local_21c + 1) {
    pFStack_228 = Descriptor::field(this->descriptor_,local_21c);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_218,&stack0xfffffffffffffdd8);
  }
  anon_unknown_0::OptimizePadding
            ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_218);
  for (local_22c = 0; uVar6 = (ulong)local_22c,
      sVar10 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)local_218), uVar6 < sVar10; local_22c = local_22c + 1) {
    ppFVar11 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_218,(long)local_22c);
    pFVar12 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar11);
    (*pFVar12->_vptr_FieldGenerator[2])(pFVar12,printer);
  }
  io::Printer::Print(printer,"\nmutable int _cached_size_;\n");
  iVar4 = Descriptor::field_count(this->descriptor_);
  if (iVar4 < 1) {
    io::Printer::Print(printer,"::google::protobuf::uint32 _has_bits_[1];\n\n");
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n\n");
  }
  pFVar7 = Descriptor::file(this->descriptor_);
  this_07 = Descriptor::file(this->descriptor_);
  psVar8 = FileDescriptor::name_abi_cxx11_(this_07);
  GlobalAddDescriptorsName(&local_250,psVar8);
  PrintHandlingOptionalStaticInitializers
            (pFVar7,printer,"friend void $dllexport_decl$ $adddescriptorsname$();\n",
             "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n","dllexport_decl",
             &(this->options_).dllexport_decl,"adddescriptorsname",&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  pFVar7 = Descriptor::file(this->descriptor_);
  psVar8 = FileDescriptor::name_abi_cxx11_(pFVar7);
  GlobalAssignDescriptorsName(&local_270,psVar8);
  pFVar7 = Descriptor::file(this->descriptor_);
  psVar8 = FileDescriptor::name_abi_cxx11_(pFVar7);
  GlobalShutdownFileName(&local_290,psVar8);
  io::Printer::Print(printer,
                     "friend void $assigndescriptorsname$();\nfriend void $shutdownfilename$();\n\n"
                     ,"assigndescriptorsname",&local_270,"shutdownfilename",&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  io::Printer::Print(printer,
                     "void InitAsDefaultInstance();\nstatic $classname$* default_instance_;\n",
                     "classname",&this->classname_);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_50,"};");
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_218);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void MessageGenerator::
GenerateClassDefinition(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassDefinition(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  map<string, string> vars;
  vars["classname"] = classname_;
  vars["field_count"] = SimpleItoa(descriptor_->field_count());
  if (options_.dllexport_decl.empty()) {
    vars["dllexport"] = "";
  } else {
    vars["dllexport"] = options_.dllexport_decl + " ";
  }
  vars["superclass"] = SuperClassName(descriptor_);

  printer->Print(vars,
    "class $dllexport$$classname$ : public $superclass$ {\n"
    " public:\n");
  printer->Indent();

  printer->Print(vars,
    "$classname$();\n"
    "virtual ~$classname$();\n"
    "\n"
    "$classname$(const $classname$& from);\n"
    "\n"
    "inline $classname$& operator=(const $classname$& from) {\n"
    "  CopyFrom(from);\n"
    "  return *this;\n"
    "}\n"
    "\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n"
      "  return _unknown_fields_;\n"
      "}\n"
      "\n"
      "inline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n"
      "  return &_unknown_fields_;\n"
      "}\n"
      "\n");
  }

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(vars,
      "static const ::google::protobuf::Descriptor* descriptor();\n");
  }

  printer->Print(vars,
    "static const $classname$& default_instance();\n"
    "\n");

  if (!StaticInitializersForced(descriptor_->file())) {
    printer->Print(vars,
      "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
      "// Returns the internal default instance pointer. This function can\n"
      "// return NULL thus should not be used by the user. This is intended\n"
      "// for Protobuf internal code. Please use default_instance() declared\n"
      "// above instead.\n"
      "static inline const $classname$* internal_default_instance() {\n"
      "  return default_instance_;\n"
      "}\n"
      "#endif\n"
      "\n");
  }


  printer->Print(vars,
    "void Swap($classname$* other);\n"
    "\n"
    "// implements Message ----------------------------------------------\n"
    "\n"
    "$classname$* New() const;\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    if (HasDescriptorMethods(descriptor_->file())) {
      printer->Print(vars,
        "void CopyFrom(const ::google::protobuf::Message& from);\n"
        "void MergeFrom(const ::google::protobuf::Message& from);\n");
    } else {
      printer->Print(vars,
        "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n");
    }

    printer->Print(vars,
      "void CopyFrom(const $classname$& from);\n"
      "void MergeFrom(const $classname$& from);\n"
      "void Clear();\n"
      "bool IsInitialized() const;\n"
      "\n"
      "int ByteSize() const;\n"
      "bool MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input);\n"
      "void SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const;\n");
    if (HasFastArraySerialization(descriptor_->file())) {
      printer->Print(
        "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n");
    }
  }

  printer->Print(vars,
    "int GetCachedSize() const { return _cached_size_; }\n"
    "private:\n"
    "void SharedCtor();\n"
    "void SharedDtor();\n"
    "void SetCachedSize(int size) const;\n"
    "public:\n"
    "\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata GetMetadata() const;\n"
      "\n");
  } else {
    printer->Print(
      "::std::string GetTypeName() const;\n"
      "\n");
  }

  printer->Print(
    "// xml support -----------------------------------------------------\n"
    "\n");

  printer->Print(vars,
    "// Parse a protocol buffer contained in a string.\n"
    "bool ParseFromXmlString(const std::string& data);\n"
    "// Like ParseFromXmlString(), but accepts messages that are missing\n"
    "// required fields.\n"
    "bool ParsePartialFromXmlString(const std::string& data);\n"
    "\n"
    "// Serialize the message and store it in the given string.  All required\n"
    "// fields must be set.\n"
    "bool SerializeToXmlString(std::string* output) const;\n"
    "// Like SerializeToXmlString(), but allows missing required fields.\n"
    "bool SerializePartialToXmlString(std::string* output) const;\n"
    "\n");

  printer->Print(
    "// nested types ----------------------------------------------------\n"
    "\n");

  // Import all nested message classes into this class's scope with typedefs.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    const Descriptor* nested_type = descriptor_->nested_type(i);
    printer->Print("typedef $nested_full_name$ $nested_name$;\n",
                   "nested_name", nested_type->name(),
                   "nested_full_name", ClassName(nested_type, false));
  }

  if (descriptor_->nested_type_count() > 0) {
    printer->Print("\n");
  }

  // Import all nested enums and their values into this class's scope with
  // typedefs and constants.
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateSymbolImports(printer);
    printer->Print("\n");
  }

  printer->Print(
    "// accessors -------------------------------------------------------\n"
    "\n");

  // Generate accessor methods for all fields.
  GenerateFieldAccessorDeclarations(printer);

  // Declare extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }


  printer->Print(
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  // Generate private members.
  printer->Outdent();
  printer->Print(" private:\n");
  printer->Indent();


  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->is_repeated()) {
      printer->Print(
        "inline void set_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
      printer->Print(
        "inline void clear_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
    }
  }
  printer->Print("\n");

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.

  // Members assumed to align to 8 bytes:

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "::google::protobuf::internal::ExtensionSet _extensions_;\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::UnknownFieldSet _unknown_fields_;\n"
      "\n");
  }

  // Field members:

  vector<const FieldDescriptor*> fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields.push_back(descriptor_->field(i));
  }
  OptimizePadding(&fields);
  for (int i = 0; i < fields.size(); ++i) {
    field_generators_.get(fields[i]).GeneratePrivateMembers(printer);
  }

  // Members assumed to align to 4 bytes:

  // TODO(kenton):  Make _cached_size_ an atomic<int> when C++ supports it.
  printer->Print(
      "\n"
      "mutable int _cached_size_;\n");

  // Generate _has_bits_.
  if (descriptor_->field_count() > 0) {
    printer->Print(vars,
      "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n"
      "\n");
  } else {
    // Zero-size arrays aren't technically allowed, and MSVC in particular
    // doesn't like them.  We still need to declare these arrays to make
    // other code compile.  Since this is an uncommon case, we'll just declare
    // them with size 1 and waste some space.  Oh well.
    printer->Print(
      "::google::protobuf::uint32 _has_bits_[1];\n"
      "\n");
  }

  // Declare AddDescriptors(), BuildDescriptors(), and ShutdownFile() as
  // friends so that they can access private static variables like
  // default_instance_ and reflection_.
  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "friend void $dllexport_decl$ $adddescriptorsname$();\n",
    // Without.
    "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n",
    // Vars.
    "dllexport_decl", options_.dllexport_decl,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "friend void $assigndescriptorsname$();\n"
    "friend void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname",
      GlobalAssignDescriptorsName(descriptor_->file()->name()),
    "shutdownfilename", GlobalShutdownFileName(descriptor_->file()->name()));

  printer->Print(
    "void InitAsDefaultInstance();\n"
    "static $classname$* default_instance_;\n",
    "classname", classname_);

  printer->Outdent();
  printer->Print(vars, "};");
}